

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeSegment::IsClosed(ON_PolyEdgeSegment *this)

{
  bool bVar1;
  int iVar2;
  ON_Curve *pOVar3;
  ON_Curve *pOVar4;
  double dVar5;
  bool local_59;
  ON_Interval local_58;
  ON_Interval local_48;
  ON_Interval local_38;
  ON_Interval local_28;
  byte local_11;
  ON_PolyEdgeSegment *pOStack_10;
  bool rc;
  ON_PolyEdgeSegment *this_local;
  
  pOStack_10 = this;
  local_11 = ON_CurveProxy::IsClosed(&this->super_ON_CurveProxy);
  local_59 = false;
  if (((!(bool)local_11) && (local_59 = false, this->m_edge != (ON_BrepEdge *)0x0)) &&
     (local_59 = false, this->m_edge->m_vi[0] == this->m_edge->m_vi[1])) {
    pOVar3 = ON_CurveProxy::ProxyCurve(&this->m_edge->super_ON_CurveProxy);
    pOVar4 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
    local_59 = false;
    if (pOVar3 == pOVar4) {
      local_28 = ON_CurveProxy::ProxyCurveDomain(&this->m_edge->super_ON_CurveProxy);
      local_38 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
      dVar5 = local_38.m_t[1];
      bVar1 = ON_Interval::operator==(&local_28,&local_38);
      local_59 = false;
      if (bVar1) {
        pOVar3 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
        local_59 = false;
        if (pOVar3 != (ON_Curve *)0x0) {
          pOVar3 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
          (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
          local_48.m_t[1] = dVar5;
          local_58 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
          local_59 = ON_Interval::operator==(&local_48,&local_58);
        }
      }
    }
  }
  if (local_59 != false) {
    iVar2 = (*(this->m_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x34])();
    local_11 = (byte)iVar2 & 1;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool ON_PolyEdgeSegment::IsClosed(void) const
{
  bool rc = ON_CurveProxy::IsClosed();
  if ( !rc
       && m_edge
       && m_edge->m_vi[0] == m_edge->m_vi[1]
       && m_edge->ProxyCurve() == ProxyCurve()
       && m_edge->ProxyCurveDomain() == ProxyCurveDomain()
       && 0 != ProxyCurve()
       && ProxyCurve()->Domain() == ProxyCurveDomain()
       )
  {
    rc = m_edge->IsClosed();
  }
  return rc;
}